

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_6,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int row;
  long lVar2;
  bool bVar3;
  float *pfVar4;
  long lVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  float fVar9;
  Mat2x3 m;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat3x2 m_1;
  Matrix<float,_3,_2> local_88;
  float local_70 [4];
  float local_60 [2];
  undefined8 local_58;
  undefined4 local_50;
  Matrix<float,_2,_3> local_48;
  float local_2c [6];
  float afStack_14 [3];
  long lVar7;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      fVar9 = 1.0;
      if (lVar2 != 0) {
        fVar9 = 0.0;
      }
      local_88.m_data.m_data[0].m_data[lVar2] = fVar9;
      fVar9 = 1.0;
      if (lVar2 != 1) {
        fVar9 = 0.0;
      }
      local_70[lVar2 + -3] = fVar9;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_88.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_88.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[2] = 0.0;
    lVar2 = 0;
    do {
      fVar9 = (float)(&DAT_00b1f8b4)[lVar2 * 2];
      local_88.m_data.m_data[0].m_data[lVar2] =
           (float)(&sr::(anonymous_namespace)::s_constInMat2x3)[lVar2 * 2];
      local_70[lVar2 + -3] = fVar9;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  pfVar1 = local_48.m_data.m_data[0].m_data + 1;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    pfVar4 = (float *)&local_48;
    bVar8 = true;
    do {
      bVar3 = bVar8;
      lVar5 = 0;
      auVar6 = _DAT_00ac4b30;
      do {
        bVar8 = SUB164(auVar6 ^ _DAT_00ac4b80,4) == -0x80000000 &&
                SUB164(auVar6 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
        if (bVar8) {
          fVar9 = 1.0;
          if (lVar2 != lVar5) {
            fVar9 = 0.0;
          }
          pfVar4[lVar5 * 2] = fVar9;
        }
        if (bVar8) {
          fVar9 = 1.0;
          if (lVar2 + -1 != lVar5) {
            fVar9 = 0.0;
          }
          pfVar4[(lVar5 + 1) * 2] = fVar9;
        }
        lVar5 = lVar5 + 2;
        lVar7 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 2;
        auVar6._8_8_ = lVar7 + 2;
      } while (lVar5 != 4);
      lVar2 = 1;
      pfVar4 = pfVar1;
      bVar8 = false;
    } while (bVar3);
    local_48.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_48.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_48.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    local_48.m_data.m_data[0].m_data[0] = 0.0;
    local_48.m_data.m_data[0].m_data[1] = 0.0;
    local_48.m_data.m_data[1].m_data[0] = 0.0;
    local_48.m_data.m_data[1].m_data[1] = 0.0;
    local_48.m_data.m_data[2].m_data[0] = 0.0;
    local_48.m_data.m_data[2].m_data[1] = 0.0;
    lVar2 = 0;
    pfVar4 = (float *)&local_48;
    bVar8 = true;
    do {
      bVar3 = bVar8;
      lVar5 = 0;
      do {
        pfVar4[lVar5 * 2] = *(float *)((long)&DAT_00b1f938 + lVar5 * 4 + lVar2);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = 0xc;
      pfVar4 = pfVar1;
      bVar8 = false;
    } while (bVar3);
  }
  tcu::operator*(&local_88,&local_48);
  local_58 = (ulong)local_58._4_4_ << 0x20;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  lVar2 = 0;
  do {
    local_60[lVar2] = local_2c[lVar2] + local_2c[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_70[2] = 0.0;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  lVar2 = 0;
  do {
    local_70[lVar2] = local_60[lVar2] + local_2c[lVar2 + 6];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_58 = 0x100000000;
  local_50 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_60[lVar2]] = local_70[lVar2 + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}